

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_filter.c
# Opt level: O0

int gdImageBrightness(gdImagePtr src,int brightness)

{
  uint uVar1;
  code *pcVar2;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  uint local_54;
  int local_50;
  int local_4c;
  FuncPtr f;
  int local_38;
  int pxl;
  int new_pxl;
  int a;
  int b;
  int g;
  int r;
  int y;
  int x;
  int brightness_local;
  gdImagePtr src_local;
  
  if (((src == (gdImagePtr)0x0) || (brightness < -0xff)) || (0xff < brightness)) {
    src_local._4_4_ = 0;
  }
  else if (brightness == 0) {
    src_local._4_4_ = 1;
  }
  else {
    pcVar2 = gdImageGetPixel;
    if (src->trueColor != 0) {
      pcVar2 = gdImageGetTrueColorPixel;
    }
    for (g = 0; g < src->sy; g = g + 1) {
      for (r = 0; r < src->sx; r = r + 1) {
        uVar1 = (*pcVar2)(src,r,g);
        if (src->trueColor == 0) {
          local_4c = src->red[(int)uVar1];
        }
        else {
          local_4c = (int)(uVar1 & 0xff0000) >> 0x10;
        }
        if (src->trueColor == 0) {
          local_50 = src->green[(int)uVar1];
        }
        else {
          local_50 = (int)(uVar1 & 0xff00) >> 8;
        }
        if (src->trueColor == 0) {
          local_54 = src->blue[(int)uVar1];
        }
        else {
          local_54 = uVar1 & 0xff;
        }
        if (src->trueColor == 0) {
          local_58 = src->alpha[(int)uVar1];
        }
        else {
          local_58 = (int)(uVar1 & 0x7f000000) >> 0x18;
        }
        local_60 = local_4c + brightness;
        local_68 = local_50 + brightness;
        local_70 = local_54 + brightness;
        if (local_60 < 0x100) {
          if (local_60 < 0) {
            local_60 = 0;
          }
          local_5c = local_60;
        }
        else {
          local_5c = 0xff;
        }
        if (local_68 < 0x100) {
          if (local_68 < 0) {
            local_68 = 0;
          }
          local_64 = local_68;
        }
        else {
          local_64 = 0xff;
        }
        if (local_70 < 0x100) {
          if (local_70 < 0) {
            local_70 = 0;
          }
          local_6c = local_70;
        }
        else {
          local_6c = 0xff;
        }
        local_38 = gdImageColorAllocateAlpha(src,local_5c,local_64,local_6c,local_58);
        if (local_38 == -1) {
          local_38 = gdImageColorClosestAlpha(src,local_5c,local_64,local_6c,local_58);
        }
        gdImageSetPixel(src,r,g,local_38);
      }
    }
    src_local._4_4_ = 1;
  }
  return src_local._4_4_;
}

Assistant:

BGD_DECLARE(int) gdImageBrightness(gdImagePtr src, int brightness)
{
	int x, y;
	int r,g,b,a;
	int new_pxl, pxl;
	FuncPtr f;

	if (src==NULL || (brightness < -255 || brightness > 255)) {
		return 0;
	}

	if (brightness==0) {
		return 1;
	}

	f = GET_PIXEL_FUNCTION(src);

	for (y=0; y<src->sy; ++y) {
		for (x=0; x<src->sx; ++x) {
			pxl = f (src, x, y);

			r = gdImageRed(src, pxl);
			g = gdImageGreen(src, pxl);
			b = gdImageBlue(src, pxl);
			a = gdImageAlpha(src, pxl);

			r = r + brightness;
			g = g + brightness;
			b = b + brightness;

			r = (r > 255)? 255 : ((r < 0)? 0:r);
			g = (g > 255)? 255 : ((g < 0)? 0:g);
			b = (b > 255)? 255 : ((b < 0)? 0:b);

			new_pxl = gdImageColorAllocateAlpha(src, (int)r, (int)g, (int)b, a);
			if (new_pxl == -1) {
				new_pxl = gdImageColorClosestAlpha(src, (int)r, (int)g, (int)b, a);
			}
			gdImageSetPixel (src, x, y, new_pxl);
		}
	}
	return 1;
}